

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

void parse_blend_axis_types(T1_Face face,T1_Loader loader)

{
  PS_Blend pPVar1;
  FT_Memory memory;
  FT_Byte *pFVar2;
  FT_String *pFVar3;
  ulong __n;
  ulong uVar4;
  T1_Token pTVar5;
  long lVar6;
  undefined1 local_a8 [8];
  T1_TokenRec axis_tokens [4];
  FT_UInt local_38;
  FT_Error local_34;
  FT_Int num_axis;
  
  pTVar5 = (T1_Token)local_a8;
  axis_tokens[3]._16_8_ = loader;
  (*(loader->parser).root.funcs.to_token_array)((PS_Parser)loader,pTVar5,4,(FT_Int *)&local_38);
  if ((int)local_38 < 0) {
    local_34 = 0xa2;
  }
  else if (local_38 - 5 < 0xfffffffc) {
    local_34 = 3;
  }
  else {
    local_34 = t1_allocate_blend(face,0,local_38);
    if (local_34 == 0) {
      pPVar1 = face->blend;
      memory = (face->root).memory;
      for (lVar6 = 0; lVar6 < (int)local_38; lVar6 = lVar6 + 1) {
        pFVar2 = pTVar5->start;
        if (*pFVar2 == '/') {
          pFVar2 = pFVar2 + 1;
          pTVar5->start = pFVar2;
        }
        uVar4 = (long)pTVar5->limit - (long)pFVar2;
        __n = uVar4 & 0xffffffff;
        if (__n == 0) {
          local_34 = 3;
          break;
        }
        pFVar3 = pPVar1->axis_names[lVar6];
        if (pFVar3 != (FT_String *)0x0) {
          ft_mem_free(memory,pFVar3);
        }
        pFVar3 = (FT_String *)ft_mem_alloc(memory,(ulong)((int)uVar4 + 1),&local_34);
        pPVar1->axis_names[lVar6] = pFVar3;
        if (local_34 != 0) break;
        memcpy(pFVar3,pTVar5->start,__n);
        pFVar3[__n] = '\0';
        pTVar5 = pTVar5 + 1;
      }
    }
  }
  *(FT_Error *)(axis_tokens[3]._16_8_ + 0x18) = local_34;
  return;
}

Assistant:

static void
  parse_blend_axis_types( T1_Face    face,
                          T1_Loader  loader )
  {
    T1_TokenRec  axis_tokens[T1_MAX_MM_AXIS];
    FT_Int       n, num_axis;
    FT_Error     error = FT_Err_Ok;
    PS_Blend     blend;
    FT_Memory    memory;


    /* take an array of objects */
    T1_ToTokenArray( &loader->parser, axis_tokens,
                     T1_MAX_MM_AXIS, &num_axis );
    if ( num_axis < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( num_axis == 0 || num_axis > T1_MAX_MM_AXIS )
    {
      FT_ERROR(( "parse_blend_axis_types: incorrect number of axes: %d\n",
                 num_axis ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* allocate blend if necessary */
    error = t1_allocate_blend( face, 0, (FT_UInt)num_axis );
    if ( error )
      goto Exit;

    blend  = face->blend;
    memory = face->root.memory;

    /* each token is an immediate containing the name of the axis */
    for ( n = 0; n < num_axis; n++ )
    {
      T1_Token  token = axis_tokens + n;
      FT_Byte*  name;
      FT_UInt   len;


      /* skip first slash, if any */
      if ( token->start[0] == '/' )
        token->start++;

      len = (FT_UInt)( token->limit - token->start );
      if ( len == 0 )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      name = (FT_Byte*)blend->axis_names[n];
      if ( name )
      {
        FT_TRACE0(( "parse_blend_axis_types:"
                    " overwriting axis name `%s' with `%*.s'\n",
                    name, len, token->start ));
        FT_FREE( name );
      }

      if ( FT_ALLOC( blend->axis_names[n], len + 1 ) )
        goto Exit;

      name = (FT_Byte*)blend->axis_names[n];
      FT_MEM_COPY( name, token->start, len );
      name[len] = '\0';
    }

  Exit:
    loader->parser.root.error = error;
  }